

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

_Bool op_bfx(DisasContext_conflict1 *s,arg_UBFX *a,_Bool u)

{
  uint ofs;
  int reg;
  ulong uVar1;
  TCGContext_conflict1 *s_00;
  TCGTemp *pTVar2;
  TCGContext_conflict1 *tcg_ctx;
  uint len;
  TCGv_i32 var;
  
  uVar1 = s->features;
  if ((uVar1 & 0x40) != 0) {
    ofs = a->lsb;
    len = a->widthm1 + 1;
    if ((int)(ofs + len) < 0x21) {
      s_00 = s->uc->tcg_ctx;
      reg = a->rn;
      pTVar2 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
      var = (TCGv_i32)((long)pTVar2 - (long)s_00);
      load_reg_var(s,var,reg);
      if (u) {
        tcg_gen_extract_i32_aarch64(s_00,var,var,ofs,len);
      }
      else {
        tcg_gen_sextract_i32_aarch64(s_00,var,var,ofs,len);
      }
      store_reg(s,a->rd,var);
    }
    else {
      unallocated_encoding_aarch64(s);
    }
  }
  return SUB41(((uint)uVar1 & 0x40) >> 6,0);
}

Assistant:

static bool op_bfx(DisasContext *s, arg_UBFX *a, bool u)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp;
    int width = a->widthm1 + 1;
    int shift = a->lsb;

    if (!ENABLE_ARCH_6T2) {
        return false;
    }
    if (shift + width > 32) {
        /* UNPREDICTABLE; we choose to UNDEF */
        unallocated_encoding(s);
        return true;
    }

    tmp = load_reg(s, a->rn);
    if (u) {
        tcg_gen_extract_i32(tcg_ctx, tmp, tmp, shift, width);
    } else {
        tcg_gen_sextract_i32(tcg_ctx, tmp, tmp, shift, width);
    }
    store_reg(s, a->rd, tmp);
    return true;
}